

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicAddCase::verify
          (ShaderAtomicAddCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  uint uVar2;
  deUint32 dVar3;
  _Rb_tree_color _Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  ulong uVar7;
  undefined8 extraout_RAX;
  int iVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  deUint32 dVar11;
  int iVar12;
  bool bVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int in_stack_00000008;
  int outputValue;
  long in_stack_00000010;
  set<int,_std::less<int>,_std::allocator<int>_> outValues;
  int local_21c;
  int local_218;
  uint local_214;
  ulong local_210;
  undefined8 local_208;
  int local_200;
  int local_1fc;
  ulong local_1f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1f0;
  ulong local_1c0;
  size_t local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1b8 = tbslen;
  local_1fc = (int)tbs;
  local_200 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
              (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1];
  uVar2 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  uVar19 = local_200 * uVar2;
  uVar18 = (ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff;
  uVar7 = (long)uVar18 / (long)(int)uVar19;
  uVar9 = (uint)CONCAT71((uint7)((ulong)((long)uVar18 % (long)(int)uVar19) >> 8) & 0xffffff,1);
  if (0 < (int)uVar7) {
    local_1c0 = uVar7 & 0xffffffff;
    local_1f8 = (ulong)uVar19;
    iVar16 = (int)sig;
    local_200 = local_200 * uVar2 * iVar16;
    local_218 = 0;
    uVar18 = 0;
    local_208 = 0;
    local_214 = uVar19;
    do {
      local_1f0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1f0._M_impl.super__Rb_tree_header._M_header;
      iVar17 = (int)uVar18;
      dVar3 = *(deUint32 *)(in_stack_00000010 + iVar17 * in_stack_00000008);
      local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
      dVar11 = (this->super_ShaderAtomicOpCase).m_initialValue;
      local_1f0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((int)uVar19 < 1) {
        if (dVar3 != dVar11) goto LAB_01462573;
LAB_01462565:
        local_208 = 0;
LAB_01462608:
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: could not find maximum expected value from group ",0x38
                  );
        std::ostream::operator<<(poVar1,(int)uVar18);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01462662:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_1f0);
        uVar9 = (uint)local_208;
        goto LAB_01462685;
      }
      iVar20 = uVar19 * iVar17;
      uVar7 = local_1f8;
      iVar8 = local_218;
      do {
        dVar11 = dVar11 + *(int *)(siglen + (long)iVar8);
        iVar8 = iVar8 + iVar16;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      if (dVar3 != dVar11) {
LAB_01462573:
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar1,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected sum ",0xf);
        std::ostream::operator<<(poVar1,dVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        std::ostream::operator<<(poVar1,dVar3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_01462662;
      }
      if ((int)local_214 < 1) goto LAB_01462565;
      uVar7 = 0;
      local_210 = uVar18;
      bVar6 = false;
      do {
        bVar13 = bVar6;
        iVar17 = (int)uVar7;
        iVar8 = iVar20 + iVar17;
        iVar12 = dVar3 - *(int *)(siglen + (long)(iVar8 * iVar16));
        local_21c = *(int *)(local_1b8 + (long)(iVar8 * local_1fc));
        if ((iVar12 < local_21c) ||
           (local_21c < (int)(this->super_ShaderAtomicOpCase).m_initialValue)) {
          local_1b0._0_8_ =
               ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: at group ",0x10);
          std::ostream::operator<<(poVar1,(int)local_210);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", invocation ",0xd);
          std::ostream::operator<<(poVar1,iVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,": expected value in range [",0x1b);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::operator<<(poVar1,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], got ",7);
          std::ostream::operator<<(poVar1,local_21c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_01462662;
        }
        if (local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var5 = local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var15 = &local_1f0._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var14 = p_Var15;
            p_Var10 = p_Var5;
            _Var4 = p_Var10[1]._M_color;
            p_Var15 = p_Var10;
            if ((int)_Var4 < local_21c) {
              p_Var15 = p_Var14;
            }
            p_Var5 = (&p_Var10->_M_left)[(int)_Var4 < local_21c];
          } while ((&p_Var10->_M_left)[(int)_Var4 < local_21c] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var15 != &local_1f0._M_impl.super__Rb_tree_header) {
            if ((int)_Var4 < local_21c) {
              p_Var10 = p_Var14;
            }
            if ((int)p_Var10[1]._M_color <= local_21c) {
              local_1b0._0_8_ =
                   ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"ERROR: at group ",0x10);
              std::ostream::operator<<(poVar1,(int)local_210);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", invocation ",0xd);
              std::ostream::operator<<(poVar1,iVar17);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,": found duplicate value ",0x18);
              std::ostream::operator<<(poVar1,local_21c);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_01462662;
            }
          }
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_1f0,&local_21c);
        iVar17 = local_200;
        uVar18 = local_210;
        uVar19 = local_214;
        uVar7 = uVar7 + 1;
        bVar6 = (bool)(bVar13 | local_21c == iVar12);
      } while (uVar7 != local_1f8);
      if (!bVar13 && local_21c != iVar12) goto LAB_01462608;
      if (local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0146250a:
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: could not find initial value from group ",0x2f);
        std::ostream::operator<<(poVar1,(int)uVar18);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_01462662;
      }
      dVar3 = (this->super_ShaderAtomicOpCase).m_initialValue;
      p_Var5 = local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var15 = &local_1f0._M_impl.super__Rb_tree_header._M_header;
      do {
        p_Var14 = p_Var15;
        p_Var10 = p_Var5;
        _Var4 = p_Var10[1]._M_color;
        p_Var15 = p_Var10;
        if ((int)_Var4 < (int)dVar3) {
          p_Var15 = p_Var14;
        }
        p_Var5 = (&p_Var10->_M_left)[(int)_Var4 < (int)dVar3];
      } while ((&p_Var10->_M_left)[(int)_Var4 < (int)dVar3] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var15 == &local_1f0._M_impl.super__Rb_tree_header) goto LAB_0146250a;
      if ((int)_Var4 < (int)dVar3) {
        p_Var10 = p_Var14;
      }
      if ((int)dVar3 < (int)p_Var10[1]._M_color) goto LAB_0146250a;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1f0);
      uVar18 = uVar18 + 1;
      local_208 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1c0 <= uVar18);
      local_218 = local_218 + iVar17;
    } while (uVar18 != local_1c0);
    uVar9 = (uint)CONCAT71((uint7)(uint3)((uint)in_stack_00000008 >> 8),1);
  }
LAB_01462685:
  return uVar9 & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>	outValues;
			bool		maxFound		= false;
			int			valueSum		= (int)m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int inputValue = *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				valueSum += inputValue;
			}

			if (groupOutput != valueSum)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected sum " << valueSum << ", got " << groupOutput << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int	inputValue		= *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				const int	outputValue		= *(const deInt32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!de::inRange(outputValue, (int)m_initialValue, valueSum-inputValue))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": expected value in range [" << m_initialValue << ", " << (valueSum-inputValue)
														   << "], got " << outputValue
									   << TestLog::EndMessage;
					return false;
				}

				if (outValues.find(outputValue) != outValues.end())
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found duplicate value " << outputValue
									   << TestLog::EndMessage;
					return false;
				}

				outValues.insert(outputValue);
				if (outputValue == valueSum-inputValue)
					maxFound = true;
			}

			if (!maxFound)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find maximum expected value from group " << groupNdx << TestLog::EndMessage;
				return false;
			}

			if (outValues.find((int)m_initialValue) == outValues.end())
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find initial value from group " << groupNdx << TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}